

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic_const&>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  pointer pDVar1;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  Diagnostic *unaff_retaddr;
  Diagnostic *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::Diagnostic> *in_stack_00000030;
  Diagnostic *in_stack_fffffffffffffff8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    pDVar1 = emplaceRealloc<slang::Diagnostic_const&>
                       (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    end(in_RDI);
    Diagnostic::Diagnostic(unaff_retaddr,in_stack_fffffffffffffff8);
    in_RDI->len = in_RDI->len + 1;
    pDVar1 = back(in_RDI);
  }
  return pDVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }